

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

SpecialProperties Catch::parseSpecialTag(string *tag)

{
  undefined1 uVar1;
  bool bVar2;
  char *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  uint uVar3;
  undefined1 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa5;
  undefined1 uVar4;
  allocator local_31;
  string *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  SpecialProperties local_4;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffffd0,".",&local_31);
  uVar1 = startsWith(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  uVar4 = true;
  if (!(bool)uVar1) {
    in_stack_ffffffffffffffa5 =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(uVar1,CONCAT16(1,CONCAT15(in_stack_ffffffffffffffa5,
                                                            CONCAT14(in_stack_ffffffffffffffa4,
                                                                     in_stack_ffffffffffffffa0)))),
                         in_stack_ffffffffffffff98);
    uVar4 = true;
    if (!(bool)in_stack_ffffffffffffffa5) {
      in_stack_ffffffffffffffa4 =
           std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           CONCAT17(uVar1,CONCAT16(1,CONCAT15(in_stack_ffffffffffffffa5,
                                                              CONCAT14(in_stack_ffffffffffffffa4,
                                                                       in_stack_ffffffffffffffa0))))
                           ,in_stack_ffffffffffffff98);
      uVar4 = in_stack_ffffffffffffffa4;
    }
  }
  uVar3 = CONCAT13(uVar4,(int3)in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd0);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if ((uVar3 & 0x1000000) == 0) {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(uVar1,CONCAT16(uVar4,CONCAT15(in_stack_ffffffffffffffa5,
                                                                   CONCAT14(
                                                  in_stack_ffffffffffffffa4,uVar3)))),
                            in_stack_ffffffffffffff98);
    if (bVar2) {
      local_4 = Throws;
    }
    else {
      bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              CONCAT17(uVar1,CONCAT16(uVar4,CONCAT15(in_stack_ffffffffffffffa5,
                                                                     CONCAT14(
                                                  in_stack_ffffffffffffffa4,uVar3)))),
                              in_stack_ffffffffffffff98);
      if (bVar2) {
        local_4 = ShouldFail;
      }
      else {
        bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(uVar1,CONCAT16(uVar4,CONCAT15(in_stack_ffffffffffffffa5,
                                                                        CONCAT14(
                                                  in_stack_ffffffffffffffa4,uVar3)))),
                                in_stack_ffffffffffffff98);
        if (bVar2) {
          local_4 = MayFail;
        }
        else {
          local_4 = None;
        }
      }
    }
  }
  else {
    local_4 = IsHidden;
  }
  return local_4;
}

Assistant:

inline TestCaseInfo::SpecialProperties parseSpecialTag( std::string const& tag ) {
        if( startsWith( tag, "." ) ||
            tag == "hide" ||
            tag == "!hide" )
            return TestCaseInfo::IsHidden;
        else if( tag == "!throws" )
            return TestCaseInfo::Throws;
        else if( tag == "!shouldfail" )
            return TestCaseInfo::ShouldFail;
        else if( tag == "!mayfail" )
            return TestCaseInfo::MayFail;
        else
            return TestCaseInfo::None;
    }